

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm.c
# Opt level: O0

void asm_snap_alloc(ASMState *as,int snapno)

{
  byte bVar1;
  uint uVar2;
  SnapEntry *pSVar3;
  uint ref_00;
  SnapShot *pSVar4;
  IRRef ref;
  SnapEntry sn;
  MSize nent;
  MSize n;
  SnapEntry *map;
  SnapShot *snap;
  int snapno_local;
  ASMState *as_local;
  
  pSVar4 = as->T->snap + snapno;
  pSVar3 = as->T->snapmap;
  uVar2 = pSVar4->mapofs;
  bVar1 = pSVar4->nent;
  as->snapfilt2 = 0;
  as->snapfilt1 = 0;
  for (sn = 0; sn < bVar1; sn = sn + 1) {
    ref_00 = pSVar3[(ulong)uVar2 + (ulong)sn] & 0xffff;
    if (0x7fff < ref_00) {
      asm_snap_alloc1(as,ref_00);
    }
  }
  return;
}

Assistant:

static void asm_snap_alloc(ASMState *as, int snapno)
{
  SnapShot *snap = &as->T->snap[snapno];
  SnapEntry *map = &as->T->snapmap[snap->mapofs];
  MSize n, nent = snap->nent;
  as->snapfilt1 = as->snapfilt2 = 0;
  for (n = 0; n < nent; n++) {
    SnapEntry sn = map[n];
    IRRef ref = snap_ref(sn);
    if (!irref_isk(ref)) {
      asm_snap_alloc1(as, ref);
      if (LJ_SOFTFP && (sn & SNAP_SOFTFPNUM)) {
	lj_assertA(irt_type(IR(ref+1)->t) == IRT_SOFTFP,
		   "snap %d[%d] points to bad SOFTFP IR %04d",
		   snapno, n, ref - REF_BIAS);
	asm_snap_alloc1(as, ref+1);
      }
    }
  }
}